

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::_::DebugComparison<kj::(anonymous_namespace)::Bar*,kj::(anonymous_namespace)::Bar*>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<kj::(anonymous_namespace)::Bar_*,_kj::(anonymous_namespace)::Bar_*>
          *params)

{
  CappedArray<char,_17UL> *in_R8;
  String local_88;
  CappedArray<char,_17UL> local_68;
  CappedArray<char,_17UL> local_48;
  
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(void **)this);
  _::Stringifier::operator*(&local_68,(Stringifier *)&_::STR,*(void **)(this + 8));
  _::concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            (&local_88,(_ *)&local_48,(CappedArray<char,_17UL> *)(this + 0x10),
             (StringPtr *)&local_68,in_R8);
  (__return_storage_ptr__->content).ptr = local_88.content.ptr;
  (__return_storage_ptr__->content).size_ = local_88.content.size_;
  (__return_storage_ptr__->content).disposer = local_88.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}